

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,String *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          CappedArray<char,_14UL> *params_6,ArrayPtr<const_char> *params_7,StringTree *params_8,
          ArrayPtr<const_char> *params_9,String *params_10,ArrayPtr<const_char> *params_11,
          ArrayPtr<const_char> *params_12,ArrayPtr<const_char> *params_13,
          CappedArray<char,_14UL> *params_14,ArrayPtr<const_char> *params_15)

{
  ArrayPtr<const_char> *rest_3;
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_f0;
  StringTree *local_d8;
  StringTree *local_d0;
  ArrayPtr<const_char> *local_c8;
  ArrayPtr<const_char> *local_c0;
  ArrayPtr<const_char> *local_b8;
  size_t local_b0;
  char *local_a8;
  long local_a0;
  size_t local_98;
  size_t sStack_90;
  size_t local_88;
  char *pcStack_80;
  undefined8 local_78;
  char *local_70;
  char *local_68;
  long local_60;
  size_t local_58;
  size_t sStack_50;
  size_t local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_b0 = this->size_;
  local_a8 = (params->text).content.ptr;
  local_a0 = params_1->size_ - 1;
  if (params_1->size_ == 0) {
    local_a0 = 0;
  }
  local_98 = (params_2->content).size_;
  sStack_90 = params_3->size_;
  local_88 = params_4->size_;
  pcStack_80 = params_5->ptr;
  local_78 = *(undefined8 *)params_6->content;
  local_70 = params_7->ptr;
  local_68 = (params_8->text).content.ptr;
  local_60 = params_9->size_ - 1;
  if (params_9->size_ == 0) {
    local_60 = 0;
  }
  local_58 = (params_10->content).size_;
  sStack_50 = params_11->size_;
  local_48 = params_12->size_;
  pcStack_40 = params_13->ptr;
  local_38 = *(undefined8 *)params_14->content;
  nums._M_len = (size_type)params_7;
  nums._M_array = (iterator)0x10;
  local_d8 = this;
  local_c8 = params_1;
  local_b8 = params_3;
  sVar1 = _::sum((_ *)&local_b0,nums);
  rest_3 = local_b8;
  __return_storage_ptr__->size_ = sVar1;
  local_b0 = 0;
  local_a8 = (params->text).content.ptr;
  local_a0 = 0;
  local_98 = (params_2->content).size_;
  sStack_90 = local_b8->size_;
  local_88 = params_4->size_;
  pcStack_80 = params_5->ptr;
  local_78 = *(undefined8 *)params_6->content;
  local_70 = (char *)0x0;
  local_68 = (params_8->text).content.ptr;
  local_60 = 0;
  local_58 = (params_10->content).size_;
  sStack_50 = params_11->size_;
  local_48 = params_12->size_;
  pcStack_40 = params_13->ptr;
  local_38 = *(undefined8 *)params_14->content;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x10;
  local_d0 = params;
  local_c0 = (ArrayPtr<const_char> *)params_2;
  sVar1 = _::sum((_ *)&local_b0,nums_00);
  heapString((String *)&local_f0,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_f0);
  Array<char>::~Array((Array<char> *)&local_f0);
  local_b0 = 1;
  local_a8 = (char *)0x0;
  local_a0 = 1;
  local_98 = 0;
  sStack_90 = 0;
  local_88 = 0;
  pcStack_80 = (char *)0x0;
  local_78 = 0;
  local_70 = (char *)0x1;
  local_68 = (char *)0x0;
  local_60 = 1;
  local_58 = 0;
  sStack_50 = 0;
  local_48 = 0;
  pcStack_40 = (char *)0x0;
  local_38 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x10;
  sVar1 = _::sum((_ *)&local_b0,nums_01);
  local_f0.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_f0.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_f0.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_f0);
  Array<kj::StringTree::Branch>::~Array(&local_f0);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_d8,(ArrayPtr<const_char> *)local_d0,
             (String *)local_c8,local_c0,rest_3,params_4,(CappedArray<char,_14UL> *)params_5,
             (ArrayPtr<const_char> *)params_6,(StringTree *)params_7,
             (ArrayPtr<const_char> *)params_8,(String *)params_9,(ArrayPtr<const_char> *)params_10,
             params_11,params_12,(CappedArray<char,_14UL> *)params_13,
             (ArrayPtr<const_char> *)params_14);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}